

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::InsertPropertyToDebuggerScope
          (ByteCodeGenerator *this,FuncInfo *funcInfo,DebuggerScope *debuggerScope,Symbol *sym)

{
  Scope *this_00;
  bool bVar1;
  PropertyId propertyId;
  FunctionBody *this_01;
  CharacterBuffer<char16_t> *key;
  Symbol *pSVar2;
  RegSlot local_38;
  DebuggerScopePropertyFlags local_34;
  RegSlot location;
  DebuggerScopePropertyFlags flag;
  FunctionBody *funcBody;
  Symbol *sym_local;
  DebuggerScope *debuggerScope_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  if (sym != (Symbol *)0x0) {
    this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
    local_34 = 0;
    local_38 = Symbol::GetLocation(sym);
    bVar1 = ShouldTrackDebuggerMetadata(this);
    if ((bVar1) && (bVar1 = FuncInfo::IsBodyAndParamScopeMerged(funcInfo), !bVar1)) {
      this_00 = funcInfo->bodyScope;
      key = Symbol::GetName(sym);
      pSVar2 = Scope::FindLocalSymbol(this_00,key);
      if (pSVar2 != (Symbol *)0x0) {
        local_34 = 0x16;
        local_38 = Js::FunctionBody::MapRegSlot(this_01,local_38);
      }
    }
    propertyId = Symbol::EnsurePosition(sym,funcInfo);
    Js::DebuggerScope::AddProperty(debuggerScope,local_38,propertyId,local_34);
  }
  return;
}

Assistant:

void ByteCodeGenerator::InsertPropertyToDebuggerScope(FuncInfo* funcInfo, Js::DebuggerScope* debuggerScope, Symbol* sym)
{
    if (sym)
    {
        Js::FunctionBody* funcBody = funcInfo->GetParsedFunctionBody();
        Js::DebuggerScopePropertyFlags flag = Js::DebuggerScopePropertyFlags_None;
        Js::RegSlot location = sym->GetLocation();
        if (ShouldTrackDebuggerMetadata() && !funcInfo->IsBodyAndParamScopeMerged() && funcInfo->bodyScope->FindLocalSymbol(sym->GetName()) != nullptr)
        {
            flag |= Js::DebuggerScopePropertyFlags_HasDuplicateInBody;
            location = funcBody->MapRegSlot(location);
        }

        debuggerScope->AddProperty(location, sym->EnsurePosition(funcInfo), flag);
    }
}